

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

event_queue_t * __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::create_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  anon_class_24_3_f9d96878 main_action;
  bool bVar1;
  exception_t *peVar2;
  queue_params_t *this_00;
  lock_factory_t *__x;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
  *pwVar3;
  event_queue_t *peVar4;
  undefined1 local_c8 [8];
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  thread;
  lock_factory_t lock_factory;
  string local_90 [32];
  key_type local_70;
  _Self local_68;
  _Self local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  agent_t *agent_local;
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  *this_local;
  
  lock._M_device = (mutex_type *)agent;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_lock);
  if ((this->m_shutdown_started & 1U) != 0) {
    local_55 = 1;
    peVar2 = (exception_t *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"shutdown was initiated",&local_41);
    exception_t::exception_t(peVar2,(string *)local_40,0x1f);
    local_55 = 0;
    __cxa_throw(peVar2,&exception_t::typeinfo,exception_t::~exception_t);
  }
  local_60._M_node =
       (_Base_ptr)
       std::
       map<const_so_5::agent_t_*,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>_>
       ::end(&this->m_agent_threads);
  local_70 = (key_type)lock._M_device;
  local_68._M_node =
       (_Base_ptr)
       std::
       map<const_so_5::agent_t_*,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>_>
       ::find(&this->m_agent_threads,&local_70);
  bVar1 = std::operator!=(&local_60,&local_68);
  if (!bVar1) {
    this_00 = active_obj::disp_params_t::queue_params(&this->m_params);
    __x = mpsc_queue_traits::queue_params_t::lock_factory(this_00);
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&thread.
                   super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,__x);
    std::
    make_shared<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,std::function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>>()>>
              ((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)local_c8);
    pwVar3 = (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
              *)std::
                __shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_c8);
    reuse::work_thread::details::
    work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
    start(pwVar3);
    main_action.agent = (agent_t *)lock._M_device;
    main_action.this = this;
    main_action.thread =
         (shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
          *)local_c8;
    details::
    do_with_rollback_on_exception<so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_1_,so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_2_>
              (main_action,
               (shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
                *)local_c8);
    pwVar3 = (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
              *)std::
                __shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_c8);
    peVar4 = reuse::work_thread::details::
             work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
             ::get_agent_binding(pwVar3);
    std::
    shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
    ::~shared_ptr((shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
                   *)local_c8);
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::~function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                 *)&thread.
                    super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    return peVar4;
  }
  lock_factory._M_invoker._6_1_ = 1;
  peVar2 = (exception_t *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"thread for the agent is already exists",
             (allocator *)((long)&lock_factory._M_invoker + 7));
  exception_t::exception_t(peVar2,(string *)local_90,0x1f);
  lock_factory._M_invoker._6_1_ = 0;
  __cxa_throw(peVar2,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

virtual event_queue_t *
		create_thread_for_agent( const agent_t & agent ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( m_shutdown_started )
					throw so_5::exception_t(
						"shutdown was initiated",
						rc_disp_create_failed );

				if( m_agent_threads.end() != m_agent_threads.find( &agent ) )
					throw so_5::exception_t(
						"thread for the agent is already exists",
						rc_disp_create_failed );

				auto lock_factory = m_params.queue_params().lock_factory();
				auto thread = std::make_shared< WORK_THREAD >(
						std::move(lock_factory) );

				thread->start();
				so_5::details::do_with_rollback_on_exception(
						[&] { m_agent_threads[ &agent ] = thread; },
						[&thread] { shutdown_and_wait( *thread ); } );

				return thread->get_agent_binding();
			}